

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int __thiscall ncnn::BinaryOp::load_param(BinaryOp *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar2;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,0);
  *(int *)(in_RDI + 0xd4) = iVar1;
  fVar2 = ParamDict::get(in_RSI,2,0.0);
  *(float *)(in_RDI + 0xd8) = fVar2;
  if (*(int *)(in_RDI + 0xd4) != 0) {
    *(undefined1 *)(in_RDI + 8) = 1;
    *(undefined1 *)(in_RDI + 9) = 1;
  }
  return 0;
}

Assistant:

int BinaryOp::load_param(const ParamDict& pd)
{
    op_type = pd.get(0, 0);
    with_scalar = pd.get(1, 0);
    b = pd.get(2, 0.f);

    if (with_scalar != 0)
    {
        one_blob_only = true;
        support_inplace = true;
    }

    return 0;
}